

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointerAnalysisFSInv.h
# Opt level: O0

bool __thiscall dg::pta::PointerAnalysisFSInv::afterProcessed(PointerAnalysisFSInv *this,PSNode *n)

{
  bool bVar1;
  PSNodeType PVar2;
  size_t sVar3;
  reference ppPVar4;
  PSNode *in_RSI;
  vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_> *in_RDI;
  MemoryMapT *pm;
  PSNode *p;
  const_iterator __end3;
  const_iterator __begin3;
  NodesVec *__range3;
  MemoryMapT *mm;
  MemoryMapT *in_stack_00000038;
  bool ret;
  PointerAnalysisFS *in_stack_00000050;
  map<dg::pta::PSNode_*,_std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>,_std::less<dg::pta::PSNode_*>,_std::allocator<std::pair<dg::pta::PSNode_*const,_std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>_>_>_>
  *in_stack_ffffffffffffffb0;
  __normal_iterator<dg::pta::PSNode_*const_*,_std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>
  local_38;
  PSNode *in_stack_ffffffffffffffd0;
  bool local_19;
  bool local_1;
  
  PVar2 = PSNode::getType(in_RSI);
  if (PVar2 == INVALIDATE_LOCALS) {
    local_1 = handleInvalidateLocals(in_stack_ffffffffffffffd0);
  }
  else {
    PVar2 = PSNode::getType(in_RSI);
    if (PVar2 == INVALIDATE_OBJECT) {
      local_1 = invalidateMemory(in_stack_ffffffffffffffd0);
    }
    else {
      PVar2 = PSNode::getType(in_RSI);
      if (PVar2 == FREE) {
        local_1 = handleFree(in_stack_ffffffffffffffd0);
      }
      else {
        local_19 = PointerAnalysisFS::afterProcessed(in_stack_00000050,(PSNode *)this);
        SubgraphNode<dg::pta::PSNode>::
        getData<std::map<dg::pta::PSNode*,std::unique_ptr<dg::pta::MemoryObject,std::default_delete<dg::pta::MemoryObject>>,std::less<dg::pta::PSNode*>,std::allocator<std::pair<dg::pta::PSNode*const,std::unique_ptr<dg::pta::MemoryObject,std::default_delete<dg::pta::MemoryObject>>>>>>
                  ((SubgraphNode<dg::pta::PSNode> *)(in_RSI + 8));
        sVar3 = SubgraphNode<dg::pta::PSNode>::predecessorsNum
                          ((SubgraphNode<dg::pta::PSNode> *)0x173438);
        if (1 < sVar3) {
          SubgraphNode<dg::pta::PSNode>::predecessors((SubgraphNode<dg::pta::PSNode> *)(in_RSI + 8))
          ;
          local_38._M_current =
               (PSNode **)
               std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>::begin(in_RDI);
          std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>::end(in_RDI);
          while (bVar1 = __gnu_cxx::operator!=
                                   ((__normal_iterator<dg::pta::PSNode_*const_*,_std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>
                                     *)in_stack_ffffffffffffffb0,
                                    (__normal_iterator<dg::pta::PSNode_*const_*,_std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>
                                     *)in_RDI), bVar1) {
            ppPVar4 = __gnu_cxx::
                      __normal_iterator<dg::pta::PSNode_*const_*,_std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>
                      ::operator*(&local_38);
            in_stack_ffffffffffffffb0 =
                 SubgraphNode<dg::pta::PSNode>::
                 getData<std::map<dg::pta::PSNode*,std::unique_ptr<dg::pta::MemoryObject,std::default_delete<dg::pta::MemoryObject>>,std::less<dg::pta::PSNode*>,std::allocator<std::pair<dg::pta::PSNode*const,std::unique_ptr<dg::pta::MemoryObject,std::default_delete<dg::pta::MemoryObject>>>>>>
                           ((SubgraphNode<dg::pta::PSNode> *)(*ppPVar4 + 8));
            if (in_stack_ffffffffffffffb0 !=
                (map<dg::pta::PSNode_*,_std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>,_std::less<dg::pta::PSNode_*>,_std::allocator<std::pair<dg::pta::PSNode_*const,_std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>_>_>_>
                 *)0x0) {
              bVar1 = handleUninitialized((PointerAnalysisFSInv *)n,in_stack_00000038,mm);
              local_19 = local_19 != false || bVar1;
            }
            __gnu_cxx::
            __normal_iterator<dg::pta::PSNode_*const_*,_std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>
            ::operator++(&local_38);
          }
        }
        local_1 = local_19;
      }
    }
  }
  return local_1;
}

Assistant:

bool afterProcessed(PSNode *n) override {
        if (n->getType() == PSNodeType::INVALIDATE_LOCALS)
            return handleInvalidateLocals(n);
        if (n->getType() == PSNodeType::INVALIDATE_OBJECT)
            return invalidateMemory(n);
        if (n->getType() == PSNodeType::FREE)
            return handleFree(n);

        assert(n->getType() != PSNodeType::FREE &&
               n->getType() != PSNodeType::INVALIDATE_OBJECT &&
               n->getType() != PSNodeType::INVALIDATE_LOCALS);

        bool ret = PointerAnalysisFS::afterProcessed(n);

        // check that all pointers in this memory map
        // are initialized in all predecessors and
        // set them to invalidated otherwise
        MemoryMapT *mm = n->getData<MemoryMapT>();
        assert(mm && "Do not have memory map");
        if (n->predecessorsNum() > 1) {
            for (PSNode *p : n->predecessors()) {
                if (MemoryMapT *pm = p->getData<MemoryMapT>()) {
                    ret |= handleUninitialized(mm, pm);
                }
            }
        }
        return ret;
    }